

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O3

void Saig_SynchTernarySimulate(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  ulong uVar5;
  void **ppvVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  
  pVVar2 = pAig->vObjs;
  uVar9 = (ulong)(uint)nWords;
  if (0 < pVVar2->nSize) {
    ppvVar3 = pVVar2->pArray;
    lVar14 = 0;
    do {
      pvVar4 = ppvVar3[lVar14];
      if ((pvVar4 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7)) {
        iVar13 = *(int *)((long)pvVar4 + 0x24);
        if (((long)iVar13 < 0) ||
           ((uVar15 = vSimInfo->nSize, (int)uVar15 <= iVar13 ||
            (uVar10 = *(ulong *)((long)pvVar4 + 8), uVar10 == 0)))) goto LAB_006707f0;
        uVar12 = *(uint *)((uVar10 & 0xfffffffffffffffe) + 0x24);
        if (((long)(int)uVar12 < 0) ||
           ((uVar15 <= uVar12 || (uVar5 = *(ulong *)((long)pvVar4 + 0x10), uVar5 == 0))))
        goto LAB_006707f0;
        uVar11 = *(uint *)((uVar5 & 0xfffffffffffffffe) + 0x24);
        if (((long)(int)uVar11 < 0) || (uVar15 <= uVar11)) goto LAB_006707f0;
        ppvVar6 = vSimInfo->pArray;
        pvVar4 = ppvVar6[iVar13];
        pvVar8 = ppvVar6[(int)uVar12];
        pvVar7 = ppvVar6[(int)uVar11];
        if ((uVar10 & 1) == 0) {
          if ((uVar5 & 1) == 0) {
            if (0 < nWords) {
              uVar10 = 0;
              do {
                uVar15 = *(uint *)((long)pvVar8 + uVar10 * 4);
                uVar12 = *(uint *)((long)pvVar7 + uVar10 * 4);
                uVar11 = uVar12 & uVar15;
                uVar15 = uVar15 >> 1;
                uVar12 = uVar12 >> 1;
                *(uint *)((long)pvVar4 + uVar10 * 4) =
                     ((~uVar15 & uVar11 & uVar12) + (uVar11 & uVar15 & ~uVar12)) * 2 & 0xaaaaaaaa |
                     uVar11;
                uVar10 = uVar10 + 1;
              } while (uVar9 != uVar10);
            }
          }
          else if (0 < nWords) {
            uVar10 = 0;
            do {
              uVar15 = *(uint *)((long)pvVar8 + uVar10 * 4);
              uVar12 = *(uint *)((long)pvVar7 + uVar10 * 4);
              uVar12 = uVar12 ^ 0x55555555 ^ uVar12 & 0x55555555 & uVar12 >> 1;
              *(uint *)((long)pvVar4 + uVar10 * 4) =
                   ((~(uVar15 >> 1) & uVar15 & uVar12 & uVar12 >> 1) +
                   (uVar12 & uVar15 & uVar15 >> 1 & ~(uVar12 >> 1))) * 2 & 0xaaaaaaaa |
                   uVar12 & uVar15;
              uVar10 = uVar10 + 1;
            } while (uVar9 != uVar10);
          }
        }
        else if ((uVar5 & 1) == 0) {
          if (0 < nWords) {
            uVar10 = 0;
            do {
              uVar15 = *(uint *)((long)pvVar8 + uVar10 * 4);
              uVar12 = uVar15 ^ 0x55555555 ^ uVar15 & 0x55555555 & uVar15 >> 1;
              uVar15 = *(uint *)((long)pvVar7 + uVar10 * 4);
              *(uint *)((long)pvVar4 + uVar10 * 4) =
                   ((~(uVar12 >> 1) & uVar12 & uVar15 & uVar15 >> 1) +
                   (~(uVar15 >> 1) & uVar15 & uVar12 & uVar12 >> 1)) * 2 & 0xaaaaaaaa |
                   uVar12 & uVar15;
              uVar10 = uVar10 + 1;
            } while (uVar9 != uVar10);
          }
        }
        else if (0 < nWords) {
          uVar10 = 0;
          do {
            uVar15 = *(uint *)((long)pvVar8 + uVar10 * 4);
            uVar12 = uVar15 ^ 0x55555555 ^ uVar15 & 0x55555555 & uVar15 >> 1;
            uVar15 = *(uint *)((long)pvVar7 + uVar10 * 4);
            uVar15 = uVar15 ^ 0x55555555 ^ uVar15 & 0x55555555 & uVar15 >> 1;
            uVar11 = uVar15 & uVar12;
            uVar12 = uVar12 >> 1;
            uVar15 = uVar15 >> 1;
            *(uint *)((long)pvVar4 + uVar10 * 4) =
                 ((~uVar12 & uVar11 & uVar15) + (uVar11 & uVar12 & ~uVar15)) * 2 & 0xaaaaaaaa |
                 uVar11;
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar2->nSize);
  }
  if (0 < pAig->nRegs) {
    pVVar2 = pAig->vCos;
    iVar13 = 0;
    do {
      uVar15 = pAig->nTruePos + iVar13;
      if (((int)uVar15 < 0) || (pVVar2->nSize <= (int)uVar15)) {
LAB_006707f0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar4 = pVVar2->pArray[uVar15];
      iVar1 = *(int *)((long)pvVar4 + 0x24);
      if (((long)iVar1 < 0) ||
         ((vSimInfo->nSize <= iVar1 || (uVar10 = *(ulong *)((long)pvVar4 + 8), uVar10 == 0))))
      goto LAB_006707f0;
      uVar15 = *(uint *)((uVar10 & 0xfffffffffffffffe) + 0x24);
      if (((long)(int)uVar15 < 0) || ((uint)vSimInfo->nSize <= uVar15)) goto LAB_006707f0;
      pvVar4 = vSimInfo->pArray[iVar1];
      pvVar8 = vSimInfo->pArray[(int)uVar15];
      if ((uVar10 & 1) == 0) {
        if (0 < nWords) {
          uVar10 = 0;
          do {
            *(undefined4 *)((long)pvVar4 + uVar10 * 4) = *(undefined4 *)((long)pvVar8 + uVar10 * 4);
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
      }
      else if (0 < nWords) {
        uVar10 = 0;
        do {
          uVar15 = *(uint *)((long)pvVar8 + uVar10 * 4);
          *(uint *)((long)pvVar4 + uVar10 * 4) =
               uVar15 ^ 0x55555555 ^ uVar15 & 0x55555555 & uVar15 >> 1;
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < pAig->nRegs);
  }
  return;
}

Assistant:

void Saig_SynchTernarySimulate( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObj;
    unsigned * pSim0, * pSim1, * pSim;
    int i, w;
    // simulate nodes
    Aig_ManForEachNode( pAig, pObj, i )
    {
        pSim  = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        pSim0 = (unsigned *)Vec_PtrEntry( vSimInfo, Aig_ObjFaninId0(pObj) );
        pSim1 = (unsigned *)Vec_PtrEntry( vSimInfo, Aig_ObjFaninId1(pObj) );
        if ( Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchAnd( Saig_SynchNot(pSim0[w]), Saig_SynchNot(pSim1[w]) );
        }
        else if ( !Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchAnd( pSim0[w], Saig_SynchNot(pSim1[w]) );
        }
        else if ( Aig_ObjFaninC0(pObj) && !Aig_ObjFaninC1(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchAnd( Saig_SynchNot(pSim0[w]), pSim1[w] );
        }
        else // if ( !Aig_ObjFaninC0(pObj) && !Aig_ObjFaninC1(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchAnd( pSim0[w], pSim1[w] );
        }
    }
    // transfer values to register inputs
    Saig_ManForEachLi( pAig, pObj, i )
    {
        pSim  = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        pSim0 = (unsigned *)Vec_PtrEntry( vSimInfo, Aig_ObjFaninId0(pObj) );
        if ( Aig_ObjFaninC0(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchNot( pSim0[w] );
        }
        else
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = pSim0[w];
        }
    }
}